

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall SpikesConsumer::initialize(SpikesConsumer *this)

{
  HFSubConsumer *pHVar1;
  void *pvVar2;
  reference pvVar3;
  long in_RDI;
  size_t i;
  HFSubConsumer *this_00;
  HFSubConsumer *local_10;
  
  zsock_set_unsubscribe(*(void **)(in_RDI + 0xa8),"");
  local_10 = (HFSubConsumer *)0x0;
  while( true ) {
    this_00 = local_10;
    pHVar1 = (HFSubConsumer *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3c8));
    if (pHVar1 <= this_00) break;
    pvVar2 = zsock_resolve(*(void **)(in_RDI + 0xa8));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3c8),(size_type)local_10);
    zmq_setsockopt(pvVar2,6,pvVar3,8);
    local_10 = (HFSubConsumer *)((long)&(local_10->super_HighFreqSub)._vptr_HighFreqSub + 2);
  }
  HFSubConsumer::initialize(this_00);
  return;
}

Assistant:

void SpikesConsumer::initialize(){
    zsock_set_unsubscribe(sub, "");
    for(size_t i = 0; i < args.indices.size(); i+=2){
        zmq_setsockopt(zsock_resolve(sub), ZMQ_SUBSCRIBE, &args.indices[i], 2*sizeof(int));
    }
    HFSubConsumer::initialize();
}